

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

void Configlist_closure(lemon *lemp)

{
  int iVar1;
  config *pcVar2;
  rule *prVar3;
  symbol *psVar4;
  rule *rp;
  config **ppcVar5;
  long lVar6;
  config *cfp;
  int k;
  long lVar7;
  rule **pprVar8;
  
  if (currentend == (config **)0x0) {
    __assert_fail("currentend!=0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/tools/lemon/lemon.c"
                  ,0x4f5,"void Configlist_closure(struct lemon *)");
  }
  ppcVar5 = &current;
  do {
    pcVar2 = *ppcVar5;
    if (pcVar2 == (config *)0x0) {
      return;
    }
    prVar3 = pcVar2->rp;
    iVar1 = pcVar2->dot;
    if ((iVar1 < prVar3->nrhs) && (psVar4 = prVar3->rhs[iVar1], psVar4->type == NONTERMINAL)) {
      if ((psVar4->rule == (rule *)0x0) && (psVar4 != lemp->errsym)) {
        ErrorMsg(lemp->filename,prVar3->line,"Nonterminal \"%s\" has no rules.",psVar4->name);
        lemp->errorcnt = lemp->errorcnt + 1;
      }
      pprVar8 = &psVar4->rule;
      while (rp = *pprVar8, rp != (rule *)0x0) {
        cfp = Configlist_add(rp,0);
        lVar6 = (long)iVar1;
        while( true ) {
          lVar6 = lVar6 + 1;
          if (prVar3->nrhs <= lVar6) goto LAB_00104127;
          psVar4 = prVar3->rhs[lVar6];
          if (psVar4->type == TERMINAL) {
            SetAdd(cfp->fws,psVar4->index);
            goto LAB_00104127;
          }
          if (psVar4->type == MULTITERMINAL) break;
          SetUnion(cfp->fws,psVar4->firstset);
          if (psVar4->lambda == LEMON_FALSE) goto LAB_00104127;
        }
        for (lVar7 = 0; lVar7 < psVar4->nsubsym; lVar7 = lVar7 + 1) {
          SetAdd(cfp->fws,psVar4->subsym[lVar7]->index);
        }
LAB_00104127:
        if (prVar3->nrhs == (int)lVar6) {
          Plink_add(&pcVar2->fplp,cfp);
        }
        pprVar8 = &rp->nextlhs;
      }
    }
    ppcVar5 = &pcVar2->next;
  } while( true );
}

Assistant:

void Configlist_closure(struct lemon *lemp)
{
  struct config *cfp, *newcfp;
  struct rule *rp, *newrp;
  struct symbol *sp, *xsp;
  int i, dot;

  assert( currentend!=0 );
  for(cfp=current; cfp; cfp=cfp->next){
    rp = cfp->rp;
    dot = cfp->dot;
    if( dot>=rp->nrhs ) continue;
    sp = rp->rhs[dot];
    if( sp->type==NONTERMINAL ){
      if( sp->rule==0 && sp!=lemp->errsym ){
        ErrorMsg(lemp->filename,rp->line,"Nonterminal \"%s\" has no rules.",
          sp->name);
        lemp->errorcnt++;
      }
      for(newrp=sp->rule; newrp; newrp=newrp->nextlhs){
        newcfp = Configlist_add(newrp,0);
        for(i=dot+1; i<rp->nrhs; i++){
          xsp = rp->rhs[i];
          if( xsp->type==TERMINAL ){
            SetAdd(newcfp->fws,xsp->index);
            break;
          }else if( xsp->type==MULTITERMINAL ){
            int k;
            for(k=0; k<xsp->nsubsym; k++){
              SetAdd(newcfp->fws, xsp->subsym[k]->index);
            }
            break;
	  }else{
            SetUnion(newcfp->fws,xsp->firstset);
            if( xsp->lambda==LEMON_FALSE ) break;
	  }
	}
        if( i==rp->nrhs ) Plink_add(&cfp->fplp,newcfp);
      }
    }
  }
  return;
}